

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O1

bool __thiscall
flatbuffers::SymbolTable<flatbuffers::EnumVal>::Add
          (SymbolTable<flatbuffers::EnumVal> *this,string *name,EnumVal *e)

{
  _Rb_tree_header *p_Var1;
  mapped_type pEVar2;
  iterator iVar3;
  mapped_type *ppEVar4;
  mapped_type local_30;
  
  local_30 = e;
  std::vector<flatbuffers::EnumVal*,std::allocator<flatbuffers::EnumVal*>>::
  emplace_back<flatbuffers::EnumVal*&>
            ((vector<flatbuffers::EnumVal*,std::allocator<flatbuffers::EnumVal*>> *)&this->vec,
             &local_30);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>_>
                  *)this,name);
  pEVar2 = local_30;
  p_Var1 = &(this->dict)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar3._M_node == p_Var1) {
    ppEVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>_>
              ::operator[](&this->dict,name);
    *ppEVar4 = pEVar2;
  }
  return (_Rb_tree_header *)iVar3._M_node != p_Var1;
}

Assistant:

bool Add(const std::string &name, T *e) {
    vec.emplace_back(e);
    auto it = dict.find(name);
    if (it != dict.end()) return true;
    dict[name] = e;
    return false;
  }